

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadConstantsTable
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  uint val;
  RegSlot location;
  uint32 local_44;
  byte bStack_40;
  uint32 len;
  int8 value;
  byte local_31 [8];
  byte ct;
  
  FunctionBody::CreateConstantTable(function);
  uVar3 = FunctionBody::GetCountField(function,ConstantCount);
  if (2 < uVar3) {
    location = 2;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      current = ReadByte(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                         local_31);
      switch(local_31[0]) {
      case 1:
        current = ReadByte(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                           &stack0xffffffffffffffc0);
        val = (uint)(char)bStack_40;
        goto LAB_008938be;
      case 2:
        current = ReadConstantSizedInt16
                            (current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                             (int16 *)&stack0xffffffffffffffc0);
        val = (uint)_bStack_40;
        goto LAB_008938be;
      case 3:
        current = ReadConstantSizedInt32
                            (current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                             (int *)&stack0xffffffffffffffc0);
        val = _bStack_40;
LAB_008938be:
        FunctionBody::RecordIntConstant(function,location,val);
        break;
      case 4:
        current = ReadDouble(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                             (double *)&stack0xffffffffffffffc0);
        FunctionBody::RecordFloatConstant(function,location,(double)_bStack_40);
        break;
      case 5:
        current = ReadStringConstant(this,current,function,(LPCWSTR *)&stack0xffffffffffffffc0,
                                     &local_44);
        bVar2 = false;
        goto LAB_008938fa;
      case 6:
        current = ReadStringConstant(this,current,function,(LPCWSTR *)&stack0xffffffffffffffc0,
                                     &local_44);
        bVar2 = true;
LAB_008938fa:
        FunctionBody::RecordStrConstant(function,location,_bStack_40,local_44,bVar2);
        break;
      case 7:
        FunctionBody::RecordNullObject(function,location);
        break;
      case 8:
        FunctionBody::RecordUndefinedObject(function,location);
        break;
      case 9:
        FunctionBody::RecordNullDisplayConstant(function,location);
        break;
      case 10:
        FunctionBody::RecordStrictNullDisplayConstant(function,location);
        break;
      case 0xb:
        FunctionBody::RecordTrueObject(function,location);
        break;
      case 0xc:
        FunctionBody::RecordFalseObject(function,location);
        break;
      case 0xd:
        _bStack_40 = (LPCOLESTR)0x0;
        current = ReadStringTemplateCallsiteConstant
                            (this,current,function,(Var *)&stack0xffffffffffffffc0);
        FunctionBody::RecordConstant(function,location,_bStack_40);
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0xd61,"((0))","Unexpected object type in ReadConstantsTable");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      location = location + 1;
      uVar3 = FunctionBody::GetCountField(function,ConstantCount);
    } while (location < uVar3);
  }
  return current;
}

Assistant:

const byte * ReadConstantsTable(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfConstantTable);
#endif

        function->CreateConstantTable();

        for (auto reg = FunctionBody::FirstRegSlot + 1; reg < function->GetConstantCount(); reg++) // Ignore first slot, it is always global or module root and has been preinitialized.
        {
            byte ct;
            current = ReadByte(current, &ct);
            switch(ct)
            {
            case ctString16:
                {
                    LPCWSTR string;
                    uint32 len;
                    current = ReadStringConstant(current, function, &string, &len);

                    function->RecordStrConstant(reg, string, len, false);
                    break;
                }
            case ctPropertyString16:
                {
                    LPCWSTR string;
                    uint32 len;
                    current = ReadStringConstant(current, function, &string, &len);

                    function->RecordStrConstant(reg, string, len, true);
                    break;
                }
            case ctStringTemplateCallsite:
                {
                    Var callsite = nullptr;
                    current = ReadStringTemplateCallsiteConstant(current, function, callsite);

                    function->RecordConstant(reg, callsite);
                    break;
                }
            case ctInt32:
                {
                    int value;
                    current = ReadConstantSizedInt32(current, &value);
                    function->RecordIntConstant(reg, value);
                    break;
                }
            case ctInt16:
                {
                    int16 value;
                    current = ReadConstantSizedInt16(current, &value);
                    function->RecordIntConstant(reg, value);
                    break;
                }
            case ctInt8:
                {
                    int8 value;
                    current = ReadByte(current, (byte *)&value);
                    function->RecordIntConstant(reg, value);
                    break;
                }
            case ctNull:
                function->RecordNullObject(reg);
                break;
            case ctUndefined:
                function->RecordUndefinedObject(reg);
                break;
            case ctNumber:
                {
                    double value;
                    current = ReadDouble(current, &value);
                    function->RecordFloatConstant(reg, value);
                    break;
                }
            case ctNullDisplay:
                function->RecordNullDisplayConstant(reg);
                break;
            case ctStrictNullDisplay:
                function->RecordStrictNullDisplayConstant(reg);
                break;
            case ctTrue:
                function->RecordTrueObject(reg);
                break;
            case ctFalse:
                function->RecordFalseObject(reg);
                break;
            default:
                AssertMsg(UNREACHED, "Unexpected object type in ReadConstantsTable");
                break;
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfConstantTable);
#endif

        return current;
    }